

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O2

optional<unsigned_int> __thiscall absl::lts_20240722::Cord::ExpectedChecksum(Cord *this)

{
  uint uVar1;
  ulong uVar2;
  Nullable<absl::cord_internal::CordRep_*> pCVar3;
  ulong uVar4;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    uVar2 = 0;
    uVar4 = 0;
  }
  else {
    pCVar3 = InlineRep::tree(&this->contents_);
    if (pCVar3->tag == '\x02') {
      pCVar3 = InlineRep::tree(&this->contents_);
      cord_internal::CordRep::crc(pCVar3);
      uVar1 = absl::lts_20240722::crc_internal::CrcCordState::Checksum();
      uVar2 = (ulong)uVar1;
      uVar4 = 0x100000000;
    }
    else {
      uVar2 = 0;
      uVar4 = 0;
    }
  }
  return (optional<unsigned_int>)(uVar2 | uVar4);
}

Assistant:

bool is_tree() const { return (rep_.tag() & 1) != 0; }